

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O0

void __thiscall
vkt::Draw::anon_unknown_0::DrawTestInstanceBase::generateRefImage
          (DrawTestInstanceBase *this,PixelBufferAccess *access,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *vertices,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *colors)

{
  PrimitiveType primitiveType;
  const_reference pvVar1;
  size_type sVar2;
  PrimitiveList local_408;
  DrawCommand local_3e8;
  undefined1 local_3b8 [8];
  VertexAttrib vertexAttribs [2];
  Renderer local_359;
  undefined1 local_358 [7];
  Renderer renderer;
  ViewportState local_32c;
  undefined1 local_314 [8];
  RenderState renderState;
  MultisamplePixelBufferAccess local_208;
  undefined1 local_1e0 [8];
  RenderTarget renderTarget;
  MultisamplePixelBufferAccess colorBuffer;
  Program program;
  undefined1 local_98 [8];
  PassthruFragShader fragShader;
  PassthruVertShader vertShader;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *colors_local;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *vertices_local;
  PixelBufferAccess *access_local;
  DrawTestInstanceBase *this_local;
  
  PassthruVertShader::PassthruVertShader
            ((PassthruVertShader *)
             &fragShader.super_FragmentShader.m_outputs.
              super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  PassthruFragShader::PassthruFragShader((PassthruFragShader *)local_98);
  rr::Program::Program
            ((Program *)&colorBuffer.m_access.super_ConstPixelBufferAccess.m_data,
             (VertexShader *)
             &fragShader.super_FragmentShader.m_outputs.
              super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(FragmentShader *)local_98,
             (GeometryShader *)0x0);
  rr::MultisamplePixelBufferAccess::fromSinglesampleAccess
            ((MultisamplePixelBufferAccess *)
             &renderTarget.m_stencilBuffer.m_access.super_ConstPixelBufferAccess.m_data,access);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess(&local_208);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess
            ((MultisamplePixelBufferAccess *)&renderState.restart.restartIndex);
  rr::RenderTarget::RenderTarget
            ((RenderTarget *)local_1e0,
             (MultisamplePixelBufferAccess *)
             &renderTarget.m_stencilBuffer.m_access.super_ConstPixelBufferAccess.m_data,&local_208,
             (MultisamplePixelBufferAccess *)&renderState.restart.restartIndex);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)local_358,
             (MultisamplePixelBufferAccess *)
             &renderTarget.m_stencilBuffer.m_access.super_ConstPixelBufferAccess.m_data);
  rr::ViewportState::ViewportState(&local_32c,(MultisampleConstPixelBufferAccess *)local_358);
  rr::RenderState::RenderState((RenderState *)local_314,&local_32c,VIEWPORTORIENTATION_LOWER_LEFT);
  rr::Renderer::Renderer(&local_359);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (vertices,0);
  rr::VertexAttrib::VertexAttrib((VertexAttrib *)local_3b8,VERTEXATTRIBTYPE_FLOAT,4,0x10,0,pvVar1);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (colors,0);
  rr::VertexAttrib::VertexAttrib
            ((VertexAttrib *)((long)&vertexAttribs[0].generic.v + 8),VERTEXATTRIBTYPE_FLOAT,4,0x10,0
             ,pvVar1);
  primitiveType = mapVkPrimitiveTopology((this->m_data).topology);
  sVar2 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                    (vertices);
  rr::PrimitiveList::PrimitiveList(&local_408,primitiveType,(int)sVar2,0);
  rr::DrawCommand::DrawCommand
            (&local_3e8,(RenderState *)local_314,(RenderTarget *)local_1e0,
             (Program *)&colorBuffer.m_access.super_ConstPixelBufferAccess.m_data,2,
             (VertexAttrib *)local_3b8,&local_408);
  rr::Renderer::draw(&local_359,&local_3e8);
  rr::Renderer::~Renderer(&local_359);
  PassthruFragShader::~PassthruFragShader((PassthruFragShader *)local_98);
  PassthruVertShader::~PassthruVertShader
            ((PassthruVertShader *)
             &fragShader.super_FragmentShader.m_outputs.
              super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void DrawTestInstanceBase::generateRefImage (const tcu::PixelBufferAccess& access, const std::vector<tcu::Vec4>& vertices, const std::vector<tcu::Vec4>& colors) const
{
	const PassthruVertShader				vertShader;
	const PassthruFragShader				fragShader;
	const rr::Program						program			(&vertShader, &fragShader);
	const rr::MultisamplePixelBufferAccess	colorBuffer		= rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(access);
	const rr::RenderTarget					renderTarget	(colorBuffer);
	const rr::RenderState					renderState		((rr::ViewportState(colorBuffer)));
	const rr::Renderer						renderer;

	const rr::VertexAttrib	vertexAttribs[] =
	{
		rr::VertexAttrib(rr::VERTEXATTRIBTYPE_FLOAT, 4, sizeof(tcu::Vec4), 0, &vertices[0]),
		rr::VertexAttrib(rr::VERTEXATTRIBTYPE_FLOAT, 4, sizeof(tcu::Vec4), 0, &colors[0])
	};

	renderer.draw(rr::DrawCommand(renderState,
								  renderTarget,
								  program,
								  DE_LENGTH_OF_ARRAY(vertexAttribs),
								  &vertexAttribs[0],
								  rr::PrimitiveList(mapVkPrimitiveTopology(m_data.topology), (deUint32)vertices.size(), 0)));
}